

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

level_enum __thiscall spdlog::logger::level(logger *this)

{
  long in_RDI;
  memory_order __b;
  
  CLI::std::operator&(relaxed,__memory_order_mask);
  return *(level_enum *)(in_RDI + 0x40);
}

Assistant:

SPDLOG_INLINE level::level_enum logger::level() const {
    return static_cast<level::level_enum>(level_.load(std::memory_order_relaxed));
}